

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::CComputeBase::CComputeBase(CComputeBase *this,TDrawFunction drawFunc)

{
  DrawIndirectBase::DrawIndirectBase(&this->super_DrawIndirectBase);
  (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_01de8680;
  this->_drawFunc = drawFunc;
  this->_program = 0;
  this->_programCompute = 0;
  this->_vao = 0;
  this->_ebo = 0;
  this->_ebo = 0;
  this->_bufferCoords = 0;
  this->_bufferColors = 0;
  this->_bufferIndirect = 0;
  return;
}

Assistant:

CComputeBase(TDrawFunction drawFunc)
		: _drawFunc(drawFunc)
		, _program(0)
		, _programCompute(0)
		, _vao(0)
		, _ebo(0)
		, _bufferCoords(0)
		, _bufferColors(0)
		, _bufferIndirect(0)
	{
	}